

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.cpp
# Opt level: O0

void pzgeom::TPZGeoQuad::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  long *plVar5;
  TPZGeoNode *this;
  TPZAdmChunkVector<TPZGeoNode,_10> *coord;
  TPZGeoMesh *mesh;
  TPZGeoNode *pTVar6;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  uint in_ESI;
  TPZGeoMesh *in_RDI;
  int64_t index;
  int i_1;
  int i;
  TPZManVector<double,_3> co;
  TPZManVector<long,_4> nodeindexes;
  TPZGeoMesh *in_stack_fffffffffffffda0;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffda8;
  TPZGeoNode *in_stack_fffffffffffffdb0;
  int64_t in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  TPZVec<double> *in_stack_fffffffffffffdd8;
  TPZManVector<double,_3> *in_stack_fffffffffffffde0;
  undefined1 local_b8 [12];
  int local_ac;
  int local_a8;
  TPZVec<double> local_98;
  TPZVec<long> local_60 [2];
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  uint local_c;
  TPZGeoMesh *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  for (local_a8 = 0; local_a8 < 3; local_a8 = local_a8 + 1) {
    pdVar4 = TPZVec<double>::operator[](local_20,(long)local_a8);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_98,(long)local_a8);
    *pdVar4 = dVar1 * 0.2 + *pdVar4;
  }
  TPZGeoMesh::NodeVec(local_8);
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffda8);
  plVar5 = TPZVec<long>::operator[](local_60,0);
  *plVar5 = (long)iVar3;
  TPZGeoMesh::NodeVec(local_8);
  TPZVec<long>::operator[](local_60,0);
  TPZChunkVector<TPZGeoNode,_10>::operator[]
            ((TPZChunkVector<TPZGeoNode,_10> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  TPZGeoNode::Initialize
            (in_stack_fffffffffffffdb0,(TPZVec<double> *)in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda0);
  pdVar4 = TPZVec<double>::operator[](local_20,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](&local_98,0);
  *pdVar4 = dVar1 * 0.6 + *pdVar4;
  TPZGeoMesh::NodeVec(local_8);
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffda8);
  plVar5 = TPZVec<long>::operator[](local_60,1);
  *plVar5 = (long)iVar3;
  TPZGeoMesh::NodeVec(local_8);
  TPZVec<long>::operator[](local_60,1);
  TPZChunkVector<TPZGeoNode,_10>::operator[]
            ((TPZChunkVector<TPZGeoNode,_10> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  TPZGeoNode::Initialize
            (in_stack_fffffffffffffdb0,(TPZVec<double> *)in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda0);
  pdVar4 = TPZVec<double>::operator[](local_20,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](&local_98,1);
  *pdVar4 = dVar1 * 0.6 + *pdVar4;
  pdVar4 = TPZVec<double>::operator[](local_20,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](&local_98,0);
  *pdVar4 = dVar1 * 0.1 + *pdVar4;
  pdVar4 = TPZVec<double>::operator[](local_20,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](&local_98,2);
  *pdVar4 = dVar1 * 0.3 + *pdVar4;
  TPZGeoMesh::NodeVec(local_8);
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffda8);
  plVar5 = TPZVec<long>::operator[](local_60,2);
  *plVar5 = (long)iVar3;
  TPZGeoMesh::NodeVec(local_8);
  TPZVec<long>::operator[](local_60,2);
  TPZChunkVector<TPZGeoNode,_10>::operator[]
            ((TPZChunkVector<TPZGeoNode,_10> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  TPZGeoNode::Initialize
            (in_stack_fffffffffffffdb0,(TPZVec<double> *)in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda0);
  for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
    pdVar4 = TPZVec<double>::operator[](local_18,(long)local_ac);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_20,(long)local_ac);
    dVar2 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_98,(long)local_ac);
    *pdVar4 = dVar2 * 0.2 + dVar1;
  }
  pdVar4 = TPZVec<double>::operator[](local_20,1);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](&local_98,1);
  *pdVar4 = dVar1 * 0.4 + *pdVar4;
  pdVar4 = TPZVec<double>::operator[](local_20,2);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](&local_98,2);
  *pdVar4 = dVar1 * -0.2 + *pdVar4;
  TPZGeoMesh::NodeVec(local_8);
  iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffda8);
  this = (TPZGeoNode *)(long)iVar3;
  plVar5 = TPZVec<long>::operator[](local_60,3);
  *plVar5 = (long)this;
  coord = TPZGeoMesh::NodeVec(local_8);
  mesh = (TPZGeoMesh *)TPZVec<long>::operator[](local_60,3);
  pTVar6 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     ((TPZChunkVector<TPZGeoNode,_10> *)CONCAT44(iVar3,in_stack_fffffffffffffdc0),
                      (int64_t)plVar5);
  TPZGeoNode::Initialize(this,(TPZVec<double> *)coord,mesh);
  (*(local_8->super_TPZSavable)._vptr_TPZSavable[0xc])
            (local_8,3,local_60,(ulong)local_c,local_b8,1,pTVar6);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)mesh);
  TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)mesh);
  return;
}

Assistant:

void TPZGeoQuad::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<int64_t,4> nodeindexes(4);
        TPZManVector<REAL,3> co(lowercorner);
        for (int i=0; i<3; i++) {
            co[i] += 0.2*size[i];
        }

        nodeindexes[0] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[0]].Initialize(co, gmesh);
        co[0] += 0.6 * size[0];
        nodeindexes[1] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[1]].Initialize(co, gmesh);
        co[1] += 0.6 * size[0];
        co[0] += 0.1 * size[0];
        co[2] += 0.3 * size[0];
        nodeindexes[2] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[2]].Initialize(co, gmesh);
        for (int i = 0; i < 3; i++) co[i] = lowercorner[i] + 0.2 * size[i];
        co[1] += 0.4 * size[1];
        co[2] -= 0.2 * size[2];
        nodeindexes[3] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[3]].Initialize(co, gmesh);
        int64_t index;
        gmesh.CreateGeoElement(EQuadrilateral, nodeindexes, matid, index);
    }